

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Generators<unary_op_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_trng::optimized_impl::uint128>_>
* __thiscall
Catch::Generators::
makeGenerators<unary_op_tuple<std::__cxx11::string,trng::optimized_impl::uint128>,unary_op_tuple<std::__cxx11::string,trng::optimized_impl::uint128>,unary_op_tuple<std::__cxx11::string,trng::optimized_impl::uint128>>
          (Generators<unary_op_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_trng::optimized_impl::uint128>_>
           *__return_storage_ptr__,Generators *this,
          unary_op_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_trng::optimized_impl::uint128>
          *val,unary_op_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_trng::optimized_impl::uint128>
               *moreGenerators,
          unary_op_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_trng::optimized_impl::uint128>
          *moreGenerators_1)

{
  IGenerator<unary_op_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_trng::optimized_impl::uint128>_>
  *in_RAX;
  pointer *__ptr;
  _Head_base<0UL,_Catch::Generators::IGenerator<unary_op_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_trng::optimized_impl::uint128>_>_*,_false>
  local_28;
  
  local_28._M_head_impl = in_RAX;
  value<unary_op_tuple<std::__cxx11::string,trng::optimized_impl::uint128>>
            ((Generators *)&local_28,
             (unary_op_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_trng::optimized_impl::uint128>
              *)this);
  Generators<unary_op_tuple<std::__cxx11::string,trng::optimized_impl::uint128>>::
  Generators<Catch::Generators::GeneratorWrapper<unary_op_tuple<std::__cxx11::string,trng::optimized_impl::uint128>>,unary_op_tuple<std::__cxx11::string,trng::optimized_impl::uint128>,unary_op_tuple<std::__cxx11::string,trng::optimized_impl::uint128>>
            ((Generators<unary_op_tuple<std::__cxx11::string,trng::optimized_impl::uint128>> *)
             __return_storage_ptr__,
             (GeneratorWrapper<unary_op_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_trng::optimized_impl::uint128>_>
              *)&local_28,val,moreGenerators);
  if (local_28._M_head_impl !=
      (IGenerator<unary_op_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_trng::optimized_impl::uint128>_>
       *)0x0) {
    (*((local_28._M_head_impl)->super_GeneratorUntypedBase)._vptr_GeneratorUntypedBase[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

auto makeGenerators( T&& val, Gs &&... moreGenerators ) -> Generators<T> {
        return makeGenerators( value( std::forward<T>( val ) ), std::forward<Gs>( moreGenerators )... );
    }